

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

bool __thiscall wasm::Type::isExn(Type *this)

{
  HeapType HVar1;
  
  if ((this->id & 1) == 0 && 6 < this->id) {
    HVar1 = getHeapType(this);
    return ((uint)HVar1.id & 0x7b) == 0x48 && HVar1.id < 0x7d;
  }
  return false;
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }